

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O1

energy_t __thiscall
s_energy_matrix::compute_internal_restricted
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,paramT *params,
          vector<int,_std::allocator<int>_> *up)

{
  long lVar1;
  long lVar2;
  int type;
  short *psVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int n2;
  
  iVar4 = j + -5;
  iVar10 = 10000000;
  if (i < iVar4) {
    lVar11 = (long)i;
    type = pair[this->S_[lVar11]][this->S_[j]];
    if (i + 0x1f < iVar4) {
      iVar4 = i + 0x1f;
    }
    iVar13 = (j - i) + -2;
    iVar10 = 10000000;
    lVar12 = lVar11;
    do {
      lVar1 = lVar12 + 1;
      iVar5 = (j - i) + (int)lVar1;
      iVar8 = (int)lVar12 + 0x25;
      if (iVar5 < iVar8) {
        iVar5 = iVar8;
      }
      iVar8 = ~i + (int)lVar1;
      if (iVar5 + -0x20 < j &&
          iVar8 <= (up->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar12]) {
        n2 = 0;
        lVar7 = (long)j;
        iVar14 = iVar13;
        do {
          lVar2 = lVar7 + -1;
          if (n2 <= (up->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[j + -1]) {
            psVar3 = this->S1_;
            iVar6 = E_IntLoop(iVar8,n2,type,rtype[pair[this->S_[lVar1]][this->S_[lVar7 + -1]]],
                              (int)psVar3[lVar11 + 1],(int)psVar3[j + -1],(int)psVar3[lVar12],
                              (int)psVar3[lVar7],params);
            iVar9 = 10000000;
            if (lVar1 < lVar2) {
              iVar9 = (this->nodes).
                      super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar1] + iVar14].energy;
            }
            if (iVar9 + iVar6 < iVar10) {
              iVar10 = iVar9 + iVar6;
            }
          }
          n2 = n2 + 1;
          iVar14 = iVar14 + -1;
          lVar7 = lVar2;
        } while (iVar5 + -0x20 < lVar2);
      }
      iVar13 = iVar13 + -1;
      lVar12 = lVar1;
    } while (lVar1 < iVar4);
  }
  return iVar10;
}

Assistant:

energy_t s_energy_matrix::compute_internal_restricted(cand_pos_t i, cand_pos_t j, const paramT *params, std::vector<int> &up){
	energy_t v_iloop = INF;
	cand_pos_t max_k = std::min(j-TURN-2,i+MAXLOOP+1);
	const int ptype_closing = pair[S_[i]][S_[j]];
	for ( cand_pos_t k=i+1; k<=max_k; ++k) {
		
		cand_pos_t min_l=std::max(k+TURN+1 + MAXLOOP+2, k+j-i) - MAXLOOP-2;
        if((up[k-1]>=(k-i-1))){
            for (int l=j-1; l>=min_l; --l) {
                if(up[j-1]>=(j-l-1)){
                    energy_t v_iloop_kl = E_IntLoop(k-i-1,j-l-1,ptype_closing,rtype[pair[S_[k]][S_[l]]],S1_[i+1],S1_[j-1],S1_[k-1],S1_[l+1],const_cast<paramT *>(params)) + get_energy(k,l);
                    v_iloop = std::min(v_iloop,v_iloop_kl);
                }
            }
        }
	}
	return v_iloop;
}